

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

void rffti1_ps(int n,float *wa,int *ifac)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  double dVar6;
  int local_60;
  int local_5c;
  int fi;
  int i;
  float argld;
  int ipm;
  int ido;
  int l2;
  int ld;
  int ip;
  int l1;
  int nfm1;
  int is;
  float argh;
  int nf;
  int ii;
  int j;
  int k1;
  int *ifac_local;
  float *wa_local;
  int n_local;
  
  iVar2 = decompose(n,ifac,rffti1_ps::ntryh);
  l1 = 0;
  ld = 1;
  for (ii = 1; ii <= iVar2 + -1; ii = ii + 1) {
    iVar1 = ifac[ii + 1];
    ido = 0;
    iVar3 = ld * iVar1;
    iVar4 = n / iVar3;
    for (nf = 1; nf <= iVar1 + -1; nf = nf + 1) {
      local_5c = l1;
      local_60 = 0;
      ido = ld + ido;
      fVar5 = (float)ido * (6.2831855 / (float)n);
      for (argh = 4.2039e-45; (int)argh <= iVar4; argh = (float)((int)argh + 2)) {
        local_60 = local_60 + 1;
        dVar6 = cos((double)((float)local_60 * fVar5));
        wa[local_5c] = (float)dVar6;
        dVar6 = sin((double)((float)local_60 * fVar5));
        wa[local_5c + 1] = (float)dVar6;
        local_5c = local_5c + 2;
      }
      l1 = iVar4 + l1;
    }
    ld = iVar3;
  }
  return;
}

Assistant:

static void rffti1_ps(int n, float *wa, int *ifac)
{
  static const int ntryh[] = { 4,2,3,5,0 };
  int k1, j, ii;

  int nf = decompose(n,ifac,ntryh);
  float argh = (2*M_PI) / n;
  int is = 0;
  int nfm1 = nf - 1;
  int l1 = 1;
  for (k1 = 1; k1 <= nfm1; k1++) {
    int ip = ifac[k1 + 1];
    int ld = 0;
    int l2 = l1*ip;
    int ido = n / l2;
    int ipm = ip - 1;
    for (j = 1; j <= ipm; ++j) {
      float argld;
      int i = is, fi=0;
      ld += l1;
      argld = ld*argh;
      for (ii = 3; ii <= ido; ii += 2) {
        i += 2;
        fi += 1;
        wa[i - 2] = cos(fi*argld);
        wa[i - 1] = sin(fi*argld);
      }
      is += ido;
    }
    l1 = l2;
  }
}